

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

Normalizer * __thiscall CoreML::Specification::Model::mutable_normalizer(Model *this)

{
  bool bVar1;
  Normalizer *this_00;
  Model *this_local;
  
  bVar1 = has_normalizer(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_normalizer(this);
    this_00 = (Normalizer *)operator_new(0x18);
    Normalizer::Normalizer(this_00);
    (this->Type_).normalizer_ = this_00;
  }
  return (Normalizer *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::Normalizer* Model::mutable_normalizer() {
  if (!has_normalizer()) {
    clear_Type();
    set_has_normalizer();
    Type_.normalizer_ = new ::CoreML::Specification::Normalizer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.normalizer)
  return Type_.normalizer_;
}